

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeThumbAddrModeIS(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[Val & 7]);
  MCOperand_CreateImm0(Inst,(ulong)(Val >> 3 & 0x1f));
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeThumbAddrModeIS(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Val, 0, 3);
	unsigned imm = fieldFromInstruction_4(Val, 3, 5);

	if (!Check(&S, DecodetGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, imm);

	return S;
}